

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O1

Variable * __thiscall
rsg::VariableManager::allocate(VariableManager *this,VariableType *type,Storage storage,char *name)

{
  pointer *pppVVar1;
  VariableScope *this_00;
  ValueScope *this_01;
  iterator __position;
  int iVar2;
  Variable *variable;
  ValueEntry *valueEntry;
  ValueEntry *local_38;
  
  this_00 = (this->m_variableScopeStack).
            super__Vector_base<rsg::VariableScope_*,_std::allocator<rsg::VariableScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  this_01 = (this->m_valueScopeStack).
            super__Vector_base<rsg::ValueScope_*,_std::allocator<rsg::ValueScope_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  iVar2 = VariableType::getScalarSize(type);
  variable = VariableScope::allocate(this_00,type,STORAGE_LOCAL,name);
  local_38 = ValueScope::allocate(this_01,variable);
  __position._M_current =
       (this->m_entryCache).
       super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_entryCache).
      super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>::
    _M_realloc_insert<rsg::ValueEntry_const*const&>
              ((vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>> *)
               &this->m_entryCache,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    pppVVar1 = &(this->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  this->m_numAllocatedScalars = this->m_numAllocatedScalars + iVar2;
  setStorage(this,variable,storage);
  return variable;
}

Assistant:

Variable* VariableManager::allocate (const VariableType& type, Variable::Storage storage, const char* name)
{
	VariableScope&	varScope	= getCurVariableScope();
	ValueScope&		valueScope	= getCurValueScope();
	int				numScalars	= type.getScalarSize();

	// Allocate in current scope
	Variable* variable = varScope.allocate(type, Variable::STORAGE_LOCAL, name);

	// Allocate value entry
	ValueEntry* valueEntry = valueScope.allocate(variable);

	// Add to cache
	m_entryCache.push_back(valueEntry);

	m_numAllocatedScalars += numScalars;

	// Set actual storage - affects uniform/shader in allocations.
	setStorage(variable, storage);

	return variable;
}